

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-model-load-cancel.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  llama_model *model;
  llama_model_params params;
  FILE *file;
  char *model_path;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef4;
  undefined1 local_c0 [72];
  long local_78;
  __0 local_69;
  undefined1 local_68 [40];
  _func_bool_float_void_ptr *local_40;
  undefined1 local_27;
  FILE *local_20;
  char *local_18;
  uint local_4;
  
  local_4 = 0;
  local_18 = get_model_or_exit(in_stack_fffffffffffffef4,
                               (char **)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8
                                                ));
  local_20 = fopen(local_18,"r");
  if (local_20 == (FILE *)0x0) {
    fprintf(_stderr,"no model at \'%s\' found\n",local_18);
    local_4 = 1;
  }
  else {
    fprintf(_stderr,"using \'%s\'\n",local_18);
    fclose(local_20);
    llama_backend_init();
    memset(local_68,0,0x48);
    local_27 = 0;
    local_40 = main::$_0::operator_cast_to_function_pointer(&local_69);
    pcVar1 = local_18;
    memcpy(local_c0,local_68,0x48);
    local_78 = llama_model_load_from_file(pcVar1);
    llama_backend_free();
    local_4 = (uint)(local_78 != 0);
  }
  return local_4;
}

Assistant:

int main(int argc, char *argv[] ) {
    auto * model_path = get_model_or_exit(argc, argv);
    auto * file = fopen(model_path, "r");
    if (file == nullptr) {
        fprintf(stderr, "no model at '%s' found\n", model_path);
        return EXIT_FAILURE;
    }

    fprintf(stderr, "using '%s'\n", model_path);
    fclose(file);

    llama_backend_init();
    auto params = llama_model_params{};
    params.use_mmap = false;
    params.progress_callback = [](float progress, void * ctx){
        (void) ctx;
        return progress > 0.50;
    };
    auto * model = llama_model_load_from_file(model_path, params);
    llama_backend_free();
    return model == nullptr ? EXIT_SUCCESS : EXIT_FAILURE;
}